

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

FILE * output_file_open(char *zFile,int bTextMode)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 *puVar3;
  char *__modes;
  
  iVar1 = strcmp(zFile,"stdout");
  if (iVar1 == 0) {
    puVar3 = (undefined8 *)&stdout;
  }
  else {
    iVar1 = strcmp(zFile,"stderr");
    if (iVar1 != 0) {
      iVar1 = strcmp(zFile,"off");
      if (iVar1 == 0) {
        return (FILE *)0x0;
      }
      __modes = "w";
      if (bTextMode == 0) {
        __modes = "wb";
      }
      pFVar2 = fopen64(zFile,__modes);
      if (pFVar2 != (FILE *)0x0) {
        return (FILE *)pFVar2;
      }
      fprintf(_stderr,"Error: cannot open \"%s\"\n",zFile);
      return (FILE *)0x0;
    }
    puVar3 = (undefined8 *)&stderr;
  }
  return (FILE *)*puVar3;
}

Assistant:

static FILE *output_file_open(const char *zFile, int bTextMode) {
	FILE *f;
	if (strcmp(zFile, "stdout") == 0) {
		f = stdout;
	} else if (strcmp(zFile, "stderr") == 0) {
		f = stderr;
	} else if (strcmp(zFile, "off") == 0) {
		f = 0;
	} else {
		f = fopen(zFile, bTextMode ? "w" : "wb");
		if (f == 0) {
			utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		}
	}
	return f;
}